

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_obj.c
# Opt level: O0

void * lj_obj_ptr(global_State *g,cTValue *o)

{
  cTValue *o_local;
  global_State *g_local;
  uint32_t *segmap;
  uint64_t seg;
  uint64_t u;
  
  if ((int)(o->field_4).it >> 0xf == -0xd) {
    g_local = (global_State *)((o->u64 & 0x7fffffffffff) + 0x30);
  }
  else if ((int)(o->field_4).it >> 0xf == -4) {
    g_local = (global_State *)
              ((ulong)*(uint *)((g->gc).lightudseg.ptr64 + (o->u64 >> 0x27 & 0xff) * 4) << 0x20 |
              o->u64 & 0x7fffffffff);
  }
  else if ((int)(o->field_4).it >> 0xf == -0xb) {
    g_local = (global_State *)((o->u64 & 0x7fffffffffff) + 0x10);
  }
  else if (((int)(o->field_4).it >> 0xf) + 4U < 0xfffffff7) {
    g_local = (global_State *)0x0;
  }
  else {
    g_local = (global_State *)(o->u64 & 0x7fffffffffff);
  }
  return g_local;
}

Assistant:

const void * LJ_FASTCALL lj_obj_ptr(global_State *g, cTValue *o)
{
  UNUSED(g);
  if (tvisudata(o))
    return uddata(udataV(o));
  else if (tvislightud(o))
    return lightudV(g, o);
  else if (LJ_HASFFI && tviscdata(o))
    return cdataptr(cdataV(o));
  else if (tvisgcv(o))
    return gcV(o);
  else
    return NULL;
}